

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandSequence.cpp
# Opt level: O0

bool __thiscall CommandSequence::Validate(CommandSequence *this,ValidateState *state)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  pointer pCVar3;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *cmd;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>
  *__range1;
  bool result;
  ValidateState *state_local;
  CommandSequence *this_local;
  
  __range1._7_1_ = false;
  __end1 = std::
           vector<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>
           ::begin(&this->commands);
  cmd = (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
        std::
        vector<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>
        ::end(&this->commands);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_*,_std::vector<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>_>
                                     *)&cmd), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_*,_std::vector<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>_>
              ::operator*(&__end1);
    pCVar3 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (this_00);
    CAssemblerCommand::applyFileInfo(pCVar3);
    pCVar3 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (this_00);
    uVar2 = (*pCVar3->_vptr_CAssemblerCommand[2])(pCVar3,state);
    if ((uVar2 & 1) != 0) {
      __range1._7_1_ = true;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_*,_std::vector<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._7_1_;
}

Assistant:

bool CommandSequence::Validate(const ValidateState &state)
{
	bool result = false;
	
	for (const std::unique_ptr<CAssemblerCommand>& cmd: commands)
	{
		cmd->applyFileInfo();
		if (cmd->Validate(state))
			result = true;
	}

	return result;
}